

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  Data *pDVar6;
  FieldDescriptor *local_e0;
  FieldDescriptor *field;
  MessageSetParser *pMStack_d0;
  int field_number;
  undefined1 *local_c8;
  uint local_bc;
  ParseContext *pPStack_b8;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageSetParser *this_local;
  LogMessage local_98;
  Voidify local_81;
  Nullable<const_char_*> local_80;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_68;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint local_34;
  ParseContext *local_30;
  ParseContext *local_28;
  ParseContext *local_20;
  ParseContext *local_18;
  undefined1 *local_10;
  
  pPStack_b8 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  do {
    bVar1 = ParseContext::Done(pPStack_b8,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)ReadTag((char *)ctx_local,&local_bc,0);
    this_00 = pPStack_b8;
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
    if ((local_bc == 0) || ((local_bc & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&pPStack_b8->super_EpsCopyInputStream,local_bc);
      return (char *)ctx_local;
    }
    if (local_bc == 0xb) {
      local_c8 = (undefined1 *)&stack0xffffffffffffff48;
      local_28 = pPStack_b8;
      local_34 = local_bc;
      _old_group_depth = (undefined1 *)&stack0xffffffffffffff30;
      iVar2 = pPStack_b8->depth_ + -1;
      pPStack_b8->depth_ = iVar2;
      pMStack_d0 = this;
      local_30 = ctx_local;
      if (iVar2 < 0) {
        local_20 = (ParseContext *)0x0;
      }
      else {
        pPStack_b8->group_depth_ = pPStack_b8->group_depth_ + 1;
        absl_log_internal_check_op_result._4_4_ = pPStack_b8->depth_;
        absl_log_internal_check_op_result._0_4_ = pPStack_b8->group_depth_;
        local_18 = ctx_local;
        local_10 = _old_group_depth;
        local_30 = (ParseContext *)ParseElement(this,(char *)ctx_local,pPStack_b8);
        if (local_30 != (ParseContext *)0x0) {
          iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                            (absl_log_internal_check_op_result._4_4_);
          iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this_00->depth_);
          local_50 = absl::lts_20250127::log_internal::Check_EQImpl
                               (iVar2,iVar3,"old_depth == depth_");
          if (local_50 != (Nullable<const_char_*>)0x0) {
            pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_68,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x491,pcVar4);
            pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar5);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_68);
          }
          iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                            ((int)absl_log_internal_check_op_result);
          iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(this_00->group_depth_);
          local_80 = absl::lts_20250127::log_internal::Check_EQImpl
                               (iVar2,iVar3,"old_group_depth == group_depth_");
          if (local_80 != (Nullable<const_char_*>)0x0) {
            pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_80);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x492,pcVar4);
            pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar5);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_98);
          }
          local_80 = (Nullable<const_char_*>)0x0;
        }
        this_00->group_depth_ = this_00->group_depth_ + -1;
        this_00->depth_ = this_00->depth_ + 1;
        bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this_00->super_EpsCopyInputStream,local_34);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_20 = local_30;
        }
        else {
          local_20 = (ParseContext *)0x0;
        }
      }
      ctx_local = local_20;
    }
    else {
      iVar2 = WireFormatLite::GetTagFieldNumber(local_bc);
      local_e0 = (FieldDescriptor *)0x0;
      bVar1 = Descriptor::IsExtensionNumber(this->descriptor,iVar2);
      if (bVar1) {
        pDVar6 = ParseContext::data(pPStack_b8);
        if (pDVar6->pool == (DescriptorPool *)0x0) {
          local_e0 = Reflection::FindKnownExtensionByNumber(this->reflection,iVar2);
        }
        else {
          pDVar6 = ParseContext::data(pPStack_b8);
          local_e0 = DescriptorPool::FindExtensionByNumber(pDVar6->pool,this->descriptor,iVar2);
        }
      }
      ctx_local = (ParseContext *)
                  _InternalParseAndMergeField
                            (this->msg,(char *)ctx_local,pPStack_b8,(ulong)local_bc,this->reflection
                             ,local_e0);
    }
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }